

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddPolyline
          (ImDrawList *this,ImVec2 *points,int points_count,ImU32 col,bool closed,float thickness)

{
  undefined4 _x;
  undefined4 _x_00;
  undefined4 _y;
  undefined4 _y_00;
  long lVar1;
  ImDrawIdx IVar2;
  uint uVar3;
  int iVar4;
  ImDrawList *pIVar5;
  ImVec2 *pIVar6;
  ImVec4 *pIVar7;
  ImDrawIdx IVar8;
  int iVar9;
  float fVar10;
  float fVar11;
  ImVec2 IVar12;
  ImVec2 IStack_2c0;
  int local_2b4;
  float local_2b0;
  float local_2ac;
  ImVec2 *local_2a8;
  ImVec2 *local_2a0;
  ImVec2 *local_298;
  ImVec2 *local_290;
  ImVec2 *local_288;
  ImVec2 *local_280;
  ImVec2 *local_278;
  ImVec2 *local_270;
  uint local_268;
  int local_264;
  ImVec2 *local_260;
  ImVec2 *local_258;
  ImVec2 *local_250;
  ImVec2 *local_248;
  float local_240;
  float local_23c;
  int local_238;
  byte local_231;
  uint local_230;
  uint local_22c;
  int local_228;
  int local_224;
  bool local_21d;
  float local_21c;
  ImDrawList *local_218;
  float local_210;
  float local_20c;
  float inv_len_1;
  float d2_3;
  float dy_1;
  float dx_1;
  ImVec2 *p2;
  ImVec2 *p1;
  int local_1e8;
  int i2_3;
  int i1_3;
  int vtx_count_1;
  int idx_count_1;
  int i_2;
  ImVec2 *out_vtx_1;
  float dm_in_y;
  float dm_in_x;
  float dm_out_y;
  float dm_out_x;
  float inv_lensq_1;
  float d2_2;
  float dm_y_1;
  float dm_x_1;
  uint idx2_1;
  int i2_2;
  int i1_2;
  uint idx1_1;
  ImVec2 local_190;
  ImVec2 local_188;
  ImVec2 local_180;
  ImVec2 local_178;
  ImVec2 local_170;
  ImVec2 local_168;
  ImVec2 local_160;
  ImVec2 local_158;
  ImVec2 local_150;
  ImVec2 local_148;
  ImVec2 local_140;
  ImVec2 local_138;
  ImVec2 local_130;
  ImVec2 local_128;
  int local_120;
  float local_11c;
  int points_last;
  float half_inner_thickness;
  int i_1;
  int i;
  ImVec2 tex_uv1;
  ImVec2 tex_uv0;
  ImVec4 tex_uvs;
  ImVec2 *out_vtx;
  float local_e0;
  float inv_lensq;
  float d2_1;
  float dm_y;
  float dm_x;
  uint idx2;
  int i2_1;
  int i1_1;
  uint idx1;
  ImVec2 local_bc;
  ImVec2 local_b4;
  ImVec2 local_ac;
  ImVec2 local_a4;
  ImVec2 local_9c;
  ImVec2 local_94;
  ImVec2 local_8c;
  float local_84;
  float local_80;
  float half_draw_size;
  float inv_len;
  float d2;
  float dy;
  float dx;
  int i2;
  int i1;
  ImVec2 *temp_points;
  ImVec2 *temp_normals;
  int local_50;
  int vtx_count;
  int idx_count;
  int iStack_44;
  bool use_texture;
  float fractional_thickness;
  int integer_thickness;
  ImU32 col_trans;
  float AA_SIZE;
  bool thick_line;
  ImVec2 IStack_30;
  int count;
  ImVec2 opaque_uv;
  float thickness_local;
  bool closed_local;
  ImU32 col_local;
  int points_count_local;
  ImVec2 *points_local;
  ImDrawList *this_local;
  
  if (1 < points_count) {
    IStack_30 = this->_Data->TexUvWhitePixel;
    local_21c = (float)points_count;
    if (!closed) {
      local_21c = (float)(points_count + -1);
    }
    AA_SIZE = local_21c;
    col_trans._3_1_ = this->_FringeScale <= thickness && thickness != this->_FringeScale;
    local_218 = this;
    opaque_uv.x = thickness;
    opaque_uv.y._3_1_ = closed;
    if ((this->Flags & 1U) == 0) {
      i1_3 = (int)local_21c * 6;
      i2_3 = (int)local_21c << 2;
      IStack_2c0.x = 2.038924e-39;
      IStack_2c0.y = 0.0;
      PrimReserve(this,i1_3,i2_3);
      for (local_1e8 = 0; local_1e8 < (int)AA_SIZE; local_1e8 = local_1e8 + 1) {
        if (local_1e8 + 1 == points_count) {
          local_2b4 = 0;
        }
        else {
          local_2b4 = local_1e8 + 1;
        }
        p1._4_4_ = local_2b4;
        p2 = points + local_1e8;
        _dy_1 = points + local_2b4;
        d2_3 = _dy_1->x - p2->x;
        inv_len_1 = _dy_1->y - p2->y;
        local_20c = d2_3 * d2_3 + inv_len_1 * inv_len_1;
        if (0.0 < local_20c) {
          IStack_2c0.x = 2.039296e-39;
          IStack_2c0.y = 0.0;
          local_210 = sqrtf(local_20c);
          local_210 = 1.0 / local_210;
          d2_3 = local_210 * d2_3;
          inv_len_1 = local_210 * inv_len_1;
        }
        fVar10 = opaque_uv.x * 0.5 * d2_3;
        fVar11 = opaque_uv.x * 0.5 * inv_len_1;
        (local_218->_VtxWritePtr->pos).x = p2->x + fVar11;
        (local_218->_VtxWritePtr->pos).y = p2->y - fVar10;
        local_218->_VtxWritePtr->uv = IStack_30;
        local_218->_VtxWritePtr->col = col;
        local_218->_VtxWritePtr[1].pos.x = _dy_1->x + fVar11;
        local_218->_VtxWritePtr[1].pos.y = _dy_1->y - fVar10;
        local_218->_VtxWritePtr[1].uv = IStack_30;
        local_218->_VtxWritePtr[1].col = col;
        local_218->_VtxWritePtr[2].pos.x = _dy_1->x - fVar11;
        local_218->_VtxWritePtr[2].pos.y = _dy_1->y + fVar10;
        local_218->_VtxWritePtr[2].uv = IStack_30;
        local_218->_VtxWritePtr[2].col = col;
        local_218->_VtxWritePtr[3].pos.x = p2->x - fVar11;
        local_218->_VtxWritePtr[3].pos.y = p2->y + fVar10;
        local_218->_VtxWritePtr[3].uv = IStack_30;
        local_218->_VtxWritePtr[3].col = col;
        local_218->_VtxWritePtr = local_218->_VtxWritePtr + 4;
        *local_218->_IdxWritePtr = (ImDrawIdx)local_218->_VtxCurrentIdx;
        local_218->_IdxWritePtr[1] = (short)local_218->_VtxCurrentIdx + 1;
        local_218->_IdxWritePtr[2] = (short)local_218->_VtxCurrentIdx + 2;
        local_218->_IdxWritePtr[3] = (ImDrawIdx)local_218->_VtxCurrentIdx;
        local_218->_IdxWritePtr[4] = (short)local_218->_VtxCurrentIdx + 2;
        local_218->_IdxWritePtr[5] = (short)local_218->_VtxCurrentIdx + 3;
        local_218->_IdxWritePtr = local_218->_IdxWritePtr + 6;
        local_218->_VtxCurrentIdx = local_218->_VtxCurrentIdx + 4;
      }
    }
    else {
      integer_thickness = (int)this->_FringeScale;
      fractional_thickness = (float)(col & 0xffffff);
      IStack_2c0.x = 2.031614e-39;
      IStack_2c0.y = 0.0;
      opaque_uv.x = ImMax<float>(thickness,1.0);
      iStack_44 = (int)opaque_uv.x;
      idx_count = (int)(opaque_uv.x - (float)iStack_44);
      local_21d = false;
      if ((((local_218->Flags & 2U) != 0) && (local_21d = false, iStack_44 < 0x3f)) &&
         (local_21d = false, (float)idx_count <= 1e-05)) {
        local_21d = (float)integer_thickness == 1.0;
      }
      vtx_count._3_1_ = local_21d;
      if (local_21d == false) {
        if ((col_trans._3_1_ & 1) == 0) {
          local_228 = (int)AA_SIZE * 0xc;
        }
        else {
          local_228 = (int)AA_SIZE * 0x12;
        }
        local_224 = local_228;
      }
      else {
        local_224 = (int)AA_SIZE * 6;
      }
      local_50 = local_224;
      if (local_21d == false) {
        if ((col_trans._3_1_ & 1) == 0) {
          local_230 = points_count * 3;
        }
        else {
          local_230 = points_count << 2;
        }
        local_22c = local_230;
      }
      else {
        local_22c = points_count << 1;
      }
      temp_normals._4_4_ = local_22c;
      IStack_2c0.x = 2.03202e-39;
      IStack_2c0.y = 0.0;
      PrimReserve(local_218,local_224,local_22c);
      local_231 = 1;
      if ((vtx_count._3_1_ & 1) == 0) {
        local_231 = col_trans._3_1_ ^ 0xff;
      }
      lVar1 = -((long)(int)(points_count * (((byte)~local_231 & 1) * 2 + 3)) * 8 + 0xfU &
               0xfffffffffffffff0);
      temp_points = (ImVec2 *)(&stack0xfffffffffffffd48 + lVar1);
      _i2 = temp_points + points_count;
      local_238 = points_count;
      for (dx = 0.0; pIVar6 = temp_points, (int)dx < (int)AA_SIZE; dx = (float)((int)dx + 1)) {
        if ((int)dx + 1 == points_count) {
          local_23c = 0.0;
        }
        else {
          local_23c = (float)((int)dx + 1);
        }
        dy = local_23c;
        d2 = points[(int)local_23c].x - points[(int)dx].x;
        inv_len = points[(int)local_23c].y - points[(int)dx].y;
        fVar10 = d2 * d2 + inv_len * inv_len;
        half_draw_size = fVar10;
        if (0.0 < fVar10) {
          *(undefined8 *)((long)&IStack_2c0 + lVar1) = 0x162194;
          local_80 = sqrtf(fVar10);
          local_80 = 1.0 / local_80;
          d2 = local_80 * d2;
          inv_len = local_80 * inv_len;
        }
        temp_points[(int)dx].x = inv_len;
        temp_points[(int)dx].y = -d2;
      }
      if ((opaque_uv.y._3_1_ & 1) == 0) {
        temp_points[points_count + -1] = temp_points[points_count + -2];
      }
      if (((vtx_count._3_1_ & 1) == 0) && ((col_trans._3_1_ & 1) != 0)) {
        local_11c = (opaque_uv.x - (float)integer_thickness) * 0.5;
        if ((opaque_uv.y._3_1_ & 1) == 0) {
          local_120 = points_count + -1;
          fVar10 = local_11c + (float)integer_thickness;
          local_2a8 = points;
          *(undefined8 *)((long)&IStack_2c0 + lVar1) = 0x162a90;
          local_130 = operator*(pIVar6,fVar10);
          pIVar6 = local_2a8;
          *(undefined8 *)((long)&IStack_2c0 + lVar1) = 0x162aab;
          local_128 = operator+(pIVar6,&local_130);
          *_i2 = local_128;
          pIVar6 = temp_points;
          fVar10 = local_11c;
          local_2a0 = points;
          *(undefined8 *)((long)&IStack_2c0 + lVar1) = 0x162add;
          local_140 = operator*(pIVar6,fVar10);
          pIVar6 = local_2a0;
          *(undefined8 *)((long)&IStack_2c0 + lVar1) = 0x162af8;
          local_138 = operator+(pIVar6,&local_140);
          _i2[1] = local_138;
          pIVar6 = temp_points;
          fVar10 = local_11c;
          local_298 = points;
          *(undefined8 *)((long)&IStack_2c0 + lVar1) = 0x162b2b;
          local_150 = operator*(pIVar6,fVar10);
          pIVar6 = local_298;
          *(undefined8 *)((long)&IStack_2c0 + lVar1) = 0x162b46;
          local_148 = operator-(pIVar6,&local_150);
          _i2[2] = local_148;
          pIVar6 = temp_points;
          fVar10 = local_11c + (float)integer_thickness;
          local_290 = points;
          *(undefined8 *)((long)&IStack_2c0 + lVar1) = 0x162b82;
          local_160 = operator*(pIVar6,fVar10);
          pIVar6 = local_290;
          *(undefined8 *)((long)&IStack_2c0 + lVar1) = 0x162b9d;
          local_158 = operator-(pIVar6,&local_160);
          _i2[3] = local_158;
          local_288 = points + local_120;
          pIVar6 = temp_points + local_120;
          fVar10 = local_11c + (float)integer_thickness;
          *(undefined8 *)((long)&IStack_2c0 + lVar1) = 0x162be8;
          local_170 = operator*(pIVar6,fVar10);
          pIVar6 = local_288;
          *(undefined8 *)((long)&IStack_2c0 + lVar1) = 0x162c03;
          IVar12 = operator+(pIVar6,&local_170);
          fVar10 = local_11c;
          _i2[local_120 << 2] = IVar12;
          local_280 = points + local_120;
          pIVar6 = temp_points + local_120;
          local_168 = IVar12;
          *(undefined8 *)((long)&IStack_2c0 + lVar1) = 0x162c51;
          local_180 = operator*(pIVar6,fVar10);
          pIVar6 = local_280;
          *(undefined8 *)((long)&IStack_2c0 + lVar1) = 0x162c6c;
          IVar12 = operator+(pIVar6,&local_180);
          fVar10 = local_11c;
          _i2[(long)(local_120 << 2) + 1] = IVar12;
          local_278 = points + local_120;
          pIVar6 = temp_points + local_120;
          local_178 = IVar12;
          *(undefined8 *)((long)&IStack_2c0 + lVar1) = 0x162cbb;
          local_190 = operator*(pIVar6,fVar10);
          pIVar6 = local_278;
          *(undefined8 *)((long)&IStack_2c0 + lVar1) = 0x162cd6;
          IVar12 = operator-(pIVar6,&local_190);
          _i2[(long)(local_120 << 2) + 2] = IVar12;
          local_270 = points + local_120;
          pIVar6 = temp_points + local_120;
          fVar10 = local_11c + (float)integer_thickness;
          local_188 = IVar12;
          *(undefined8 *)((long)&IStack_2c0 + lVar1) = 0x162d2e;
          _i1_2 = operator*(pIVar6,fVar10);
          pIVar6 = local_270;
          *(undefined8 *)((long)&IStack_2c0 + lVar1) = 0x162d49;
          IVar12 = operator-(pIVar6,(ImVec2 *)&i1_2);
          _i2[local_120 * 4 + 3] = IVar12;
        }
        i2_2 = local_218->_VtxCurrentIdx;
        for (idx2_1 = 0; pIVar5 = local_218, (int)idx2_1 < (int)AA_SIZE; idx2_1 = idx2_1 + 1) {
          if (idx2_1 + 1 == points_count) {
            local_2ac = 0.0;
          }
          else {
            local_2ac = (float)(idx2_1 + 1);
          }
          dm_x_1 = local_2ac;
          if (idx2_1 + 1 == points_count) {
            local_2b0 = (float)local_218->_VtxCurrentIdx;
          }
          else {
            local_2b0 = (float)(i2_2 + 4);
          }
          dm_y_1 = local_2b0;
          fVar10 = (temp_points[(int)idx2_1].x + temp_points[(int)local_2ac].x) * 0.5;
          fVar11 = (temp_points[(int)idx2_1].y + temp_points[(int)local_2ac].y) * 0.5;
          dm_out_x = fVar10 * fVar10 + fVar11 * fVar11;
          if (dm_out_x < 0.5) {
            dm_out_x = 0.5;
          }
          fVar10 = (1.0 / dm_out_x) * fVar10;
          fVar11 = (1.0 / dm_out_x) * fVar11;
          dm_in_x = fVar10 * (local_11c + (float)integer_thickness);
          dm_in_y = fVar11 * (local_11c + (float)integer_thickness);
          out_vtx_1._4_4_ = fVar10 * local_11c;
          out_vtx_1._0_4_ = fVar11 * local_11c;
          _idx_count_1 = _i2 + ((int)local_2ac << 2);
          _idx_count_1->x = points[(int)local_2ac].x + dm_in_x;
          _idx_count_1->y = points[(int)dm_x_1].y + dm_in_y;
          _idx_count_1[1].x = points[(int)dm_x_1].x + out_vtx_1._4_4_;
          _idx_count_1[1].y = points[(int)dm_x_1].y + out_vtx_1._0_4_;
          _idx_count_1[2].x = points[(int)dm_x_1].x - out_vtx_1._4_4_;
          _idx_count_1[2].y = points[(int)dm_x_1].y - out_vtx_1._0_4_;
          _idx_count_1[3].x = points[(int)dm_x_1].x - dm_in_x;
          _idx_count_1[3].y = points[(int)dm_x_1].y - dm_in_y;
          IVar2 = SUB42(dm_y_1,0);
          *pIVar5->_IdxWritePtr = IVar2 + 1;
          pIVar5->_IdxWritePtr[1] = (ImDrawIdx)i2_2 + 1;
          pIVar5->_IdxWritePtr[2] = (ImDrawIdx)i2_2 + 2;
          pIVar5->_IdxWritePtr[3] = (ImDrawIdx)i2_2 + 2;
          pIVar5->_IdxWritePtr[4] = IVar2 + 2;
          pIVar5->_IdxWritePtr[5] = IVar2 + 1;
          pIVar5->_IdxWritePtr[6] = IVar2 + 1;
          pIVar5->_IdxWritePtr[7] = (ImDrawIdx)i2_2 + 1;
          pIVar5->_IdxWritePtr[8] = (ImDrawIdx)i2_2;
          pIVar5->_IdxWritePtr[9] = (ImDrawIdx)i2_2;
          pIVar5->_IdxWritePtr[10] = IVar2;
          pIVar5->_IdxWritePtr[0xb] = IVar2 + 1;
          pIVar5->_IdxWritePtr[0xc] = IVar2 + 2;
          pIVar5->_IdxWritePtr[0xd] = (ImDrawIdx)i2_2 + 2;
          pIVar5->_IdxWritePtr[0xe] = (ImDrawIdx)i2_2 + 3;
          pIVar5->_IdxWritePtr[0xf] = (ImDrawIdx)i2_2 + 3;
          pIVar5->_IdxWritePtr[0x10] = IVar2 + 3;
          pIVar5->_IdxWritePtr[0x11] = IVar2 + 2;
          pIVar5->_IdxWritePtr = pIVar5->_IdxWritePtr + 0x12;
          i2_2 = (int)dm_y_1;
        }
        for (vtx_count_1 = 0; vtx_count_1 < points_count; vtx_count_1 = vtx_count_1 + 1) {
          local_218->_VtxWritePtr->pos = _i2[vtx_count_1 << 2];
          local_218->_VtxWritePtr->uv = IStack_30;
          local_218->_VtxWritePtr->col = (ImU32)fractional_thickness;
          local_218->_VtxWritePtr[1].pos = _i2[vtx_count_1 * 4 + 1];
          local_218->_VtxWritePtr[1].uv = IStack_30;
          local_218->_VtxWritePtr[1].col = col;
          local_218->_VtxWritePtr[2].pos = _i2[vtx_count_1 * 4 + 2];
          local_218->_VtxWritePtr[2].uv = IStack_30;
          local_218->_VtxWritePtr[2].col = col;
          local_218->_VtxWritePtr[3].pos = _i2[vtx_count_1 * 4 + 3];
          local_218->_VtxWritePtr[3].uv = IStack_30;
          local_218->_VtxWritePtr[3].col = (ImU32)fractional_thickness;
          local_218->_VtxWritePtr = local_218->_VtxWritePtr + 4;
        }
      }
      else {
        if ((vtx_count._3_1_ & 1) == 0) {
          local_240 = (float)integer_thickness;
        }
        else {
          local_240 = opaque_uv.x * 0.5 + 1.0;
        }
        fVar10 = local_240;
        local_84 = local_240;
        if ((opaque_uv.y._3_1_ & 1) == 0) {
          local_260 = points;
          *(undefined8 *)((long)&IStack_2c0 + lVar1) = 0x1622aa;
          local_94 = operator*(pIVar6,fVar10);
          pIVar6 = local_260;
          *(undefined8 *)((long)&IStack_2c0 + lVar1) = 0x1622c5;
          local_8c = operator+(pIVar6,&local_94);
          *_i2 = local_8c;
          pIVar6 = temp_points;
          fVar10 = local_84;
          local_258 = points;
          *(undefined8 *)((long)&IStack_2c0 + lVar1) = 0x1622f4;
          local_a4 = operator*(pIVar6,fVar10);
          pIVar6 = local_258;
          *(undefined8 *)((long)&IStack_2c0 + lVar1) = 0x16230f;
          local_9c = operator-(pIVar6,&local_a4);
          _i2[1] = local_9c;
          fVar10 = local_84;
          local_250 = points + (points_count + -1);
          pIVar6 = temp_points + (points_count + -1);
          *(undefined8 *)((long)&IStack_2c0 + lVar1) = 0x16234f;
          local_b4 = operator*(pIVar6,fVar10);
          pIVar6 = local_250;
          *(undefined8 *)((long)&IStack_2c0 + lVar1) = 0x16236a;
          IVar12 = operator+(pIVar6,&local_b4);
          fVar10 = local_84;
          _i2[points_count * 2 + -2] = IVar12;
          local_248 = points + (points_count + -1);
          pIVar6 = temp_points + (points_count + -1);
          local_ac = IVar12;
          *(undefined8 *)((long)&IStack_2c0 + lVar1) = 0x1623b6;
          _i1_1 = operator*(pIVar6,fVar10);
          pIVar6 = local_248;
          *(undefined8 *)((long)&IStack_2c0 + lVar1) = 0x1623d1;
          IVar12 = operator-(pIVar6,(ImVec2 *)&i1_1);
          _i2[(points_count + -1) * 2 + 1] = IVar12;
          local_bc = IVar12;
        }
        i2_1 = local_218->_VtxCurrentIdx;
        for (idx2 = 0; (int)idx2 < (int)AA_SIZE; idx2 = idx2 + 1) {
          if (idx2 + 1 == points_count) {
            local_264 = 0;
          }
          else {
            local_264 = idx2 + 1;
          }
          iVar4 = local_264;
          if (idx2 + 1 == points_count) {
            local_268 = local_218->_VtxCurrentIdx;
          }
          else {
            iVar9 = 3;
            if ((vtx_count._3_1_ & 1) != 0) {
              iVar9 = 2;
            }
            local_268 = i2_1 + iVar9;
          }
          uVar3 = local_268;
          fVar10 = (temp_points[(int)idx2].x + temp_points[local_264].x) * 0.5;
          fVar11 = (temp_points[(int)idx2].y + temp_points[local_264].y) * 0.5;
          local_e0 = fVar10 * fVar10 + fVar11 * fVar11;
          if (local_e0 < 0.5) {
            local_e0 = 0.5;
          }
          fVar10 = local_84 * (1.0 / local_e0) * fVar10;
          fVar11 = local_84 * (1.0 / local_e0) * fVar11;
          pIVar6 = _i2 + (local_264 << 1);
          pIVar6->x = points[local_264].x + fVar10;
          pIVar6->y = points[iVar4].y + fVar11;
          pIVar6[1].x = points[iVar4].x - fVar10;
          pIVar6[1].y = points[iVar4].y - fVar11;
          IVar8 = (ImDrawIdx)uVar3;
          IVar2 = (ImDrawIdx)i2_1;
          if ((vtx_count._3_1_ & 1) == 0) {
            *local_218->_IdxWritePtr = IVar8;
            local_218->_IdxWritePtr[1] = IVar2;
            local_218->_IdxWritePtr[2] = IVar2 + 2;
            local_218->_IdxWritePtr[3] = IVar2 + 2;
            local_218->_IdxWritePtr[4] = IVar8 + 2;
            local_218->_IdxWritePtr[5] = IVar8;
            local_218->_IdxWritePtr[6] = IVar8 + 1;
            local_218->_IdxWritePtr[7] = IVar2 + 1;
            local_218->_IdxWritePtr[8] = IVar2;
            local_218->_IdxWritePtr[9] = IVar2;
            local_218->_IdxWritePtr[10] = IVar8;
            local_218->_IdxWritePtr[0xb] = IVar8 + 1;
            local_218->_IdxWritePtr = local_218->_IdxWritePtr + 0xc;
          }
          else {
            *local_218->_IdxWritePtr = IVar8;
            local_218->_IdxWritePtr[1] = IVar2;
            local_218->_IdxWritePtr[2] = IVar2 + 1;
            local_218->_IdxWritePtr[3] = IVar8 + 1;
            local_218->_IdxWritePtr[4] = IVar2 + 1;
            local_218->_IdxWritePtr[5] = IVar8;
            local_218->_IdxWritePtr = local_218->_IdxWritePtr + 6;
          }
          i2_1 = uVar3;
        }
        if ((vtx_count._3_1_ & 1) == 0) {
          for (points_last = 0; points_last < points_count; points_last = points_last + 1) {
            local_218->_VtxWritePtr->pos = points[points_last];
            local_218->_VtxWritePtr->uv = IStack_30;
            local_218->_VtxWritePtr->col = col;
            local_218->_VtxWritePtr[1].pos = _i2[points_last << 1];
            local_218->_VtxWritePtr[1].uv = IStack_30;
            local_218->_VtxWritePtr[1].col = (ImU32)fractional_thickness;
            local_218->_VtxWritePtr[2].pos = _i2[points_last * 2 + 1];
            local_218->_VtxWritePtr[2].uv = IStack_30;
            local_218->_VtxWritePtr[2].col = (ImU32)fractional_thickness;
            local_218->_VtxWritePtr = local_218->_VtxWritePtr + 3;
          }
        }
        else {
          pIVar7 = local_218->_Data->TexUvLines + iStack_44;
          _x = pIVar7->x;
          _y = pIVar7->y;
          _x_00 = pIVar7->z;
          _y_00 = pIVar7->w;
          *(undefined8 *)((long)&IStack_2c0 + lVar1) = 0x16288f;
          ImVec2::ImVec2(&tex_uv1,(float)_x,(float)_y);
          *(undefined8 *)((long)&IStack_2c0 + lVar1) = 0x1628ab;
          ImVec2::ImVec2((ImVec2 *)&i_1,(float)_x_00,(float)_y_00);
          for (half_inner_thickness = 0.0; (int)half_inner_thickness < points_count;
              half_inner_thickness = (float)((int)half_inner_thickness + 1)) {
            local_218->_VtxWritePtr->pos = _i2[(int)half_inner_thickness << 1];
            local_218->_VtxWritePtr->uv = tex_uv1;
            local_218->_VtxWritePtr->col = col;
            local_218->_VtxWritePtr[1].pos = _i2[(int)half_inner_thickness * 2 + 1];
            local_218->_VtxWritePtr[1].uv = _i_1;
            local_218->_VtxWritePtr[1].col = col;
            local_218->_VtxWritePtr = local_218->_VtxWritePtr + 2;
          }
        }
      }
      local_218->_VtxCurrentIdx = (temp_normals._4_4_ & 0xffff) + local_218->_VtxCurrentIdx;
    }
  }
  return;
}

Assistant:

void ImDrawList::AddPolyline(const ImVec2* points, const int points_count, ImU32 col, bool closed, float thickness)
{
    if (points_count < 2)
        return;

    const ImVec2 opaque_uv = _Data->TexUvWhitePixel;
    const int count = closed ? points_count : points_count - 1; // The number of line segments we need to draw
    const bool thick_line = (thickness > _FringeScale);

    if (Flags & ImDrawListFlags_AntiAliasedLines)
    {
        // Anti-aliased stroke
        const float AA_SIZE = _FringeScale;
        const ImU32 col_trans = col & ~IM_COL32_A_MASK;

        // Thicknesses <1.0 should behave like thickness 1.0
        thickness = ImMax(thickness, 1.0f);
        const int integer_thickness = (int)thickness;
        const float fractional_thickness = thickness - integer_thickness;

        // Do we want to draw this line using a texture?
        // - For now, only draw integer-width lines using textures to avoid issues with the way scaling occurs, could be improved.
        // - If AA_SIZE is not 1.0f we cannot use the texture path.
        const bool use_texture = (Flags & ImDrawListFlags_AntiAliasedLinesUseTex) && (integer_thickness < IM_DRAWLIST_TEX_LINES_WIDTH_MAX) && (fractional_thickness <= 0.00001f) && (AA_SIZE == 1.0f);

        // We should never hit this, because NewFrame() doesn't set ImDrawListFlags_AntiAliasedLinesUseTex unless ImFontAtlasFlags_NoBakedLines is off
        IM_ASSERT_PARANOID(!use_texture || !(_Data->Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines));

        const int idx_count = use_texture ? (count * 6) : (thick_line ? count * 18 : count * 12);
        const int vtx_count = use_texture ? (points_count * 2) : (thick_line ? points_count * 4 : points_count * 3);
        PrimReserve(idx_count, vtx_count);

        // Temporary buffer
        // The first <points_count> items are normals at each line point, then after that there are either 2 or 4 temp points for each line point
        ImVec2* temp_normals = (ImVec2*)alloca(points_count * ((use_texture || !thick_line) ? 3 : 5) * sizeof(ImVec2)); //-V630
        ImVec2* temp_points = temp_normals + points_count;

        // Calculate normals (tangents) for each line segment
        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1;
            float dx = points[i2].x - points[i1].x;
            float dy = points[i2].y - points[i1].y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            temp_normals[i1].x = dy;
            temp_normals[i1].y = -dx;
        }
        if (!closed)
            temp_normals[points_count - 1] = temp_normals[points_count - 2];

        // If we are drawing a one-pixel-wide line without a texture, or a textured line of any width, we only need 2 or 3 vertices per point
        if (use_texture || !thick_line)
        {
            // [PATH 1] Texture-based lines (thick or non-thick)
            // [PATH 2] Non texture-based lines (non-thick)

            // The width of the geometry we need to draw - this is essentially <thickness> pixels for the line itself, plus "one pixel" for AA.
            // - In the texture-based path, we don't use AA_SIZE here because the +1 is tied to the generated texture
            //   (see ImFontAtlasBuildRenderLinesTexData() function), and so alternate values won't work without changes to that code.
            // - In the non texture-based paths, we would allow AA_SIZE to potentially be != 1.0f with a patch (e.g. fringe_scale patch to
            //   allow scaling geometry while preserving one-screen-pixel AA fringe).
            const float half_draw_size = use_texture ? ((thickness * 0.5f) + 1) : AA_SIZE;

            // If line is not closed, the first and last points need to be generated differently as there are no normals to blend
            if (!closed)
            {
                temp_points[0] = points[0] + temp_normals[0] * half_draw_size;
                temp_points[1] = points[0] - temp_normals[0] * half_draw_size;
                temp_points[(points_count-1)*2+0] = points[points_count-1] + temp_normals[points_count-1] * half_draw_size;
                temp_points[(points_count-1)*2+1] = points[points_count-1] - temp_normals[points_count-1] * half_draw_size;
            }

            // Generate the indices to form a number of triangles for each line segment, and the vertices for the line edges
            // This takes points n and n+1 and writes into n+1, with the first point in a closed line being generated from the final one (as n+1 wraps)
            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx; // Vertex index for start of line segment
            for (int i1 = 0; i1 < count; i1++) // i1 is the first point of the line segment
            {
                const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1; // i2 is the second point of the line segment
                const unsigned int idx2 = ((i1 + 1) == points_count) ? _VtxCurrentIdx : (idx1 + (use_texture ? 2 : 3)); // Vertex index for end of segment

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                dm_x *= half_draw_size; // dm_x, dm_y are offset to the outer edge of the AA area
                dm_y *= half_draw_size;

                // Add temporary vertexes for the outer edges
                ImVec2* out_vtx = &temp_points[i2 * 2];
                out_vtx[0].x = points[i2].x + dm_x;
                out_vtx[0].y = points[i2].y + dm_y;
                out_vtx[1].x = points[i2].x - dm_x;
                out_vtx[1].y = points[i2].y - dm_y;

                if (use_texture)
                {
                    // Add indices for two triangles
                    _IdxWritePtr[0] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[1] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[2] = (ImDrawIdx)(idx1 + 1); // Right tri
                    _IdxWritePtr[3] = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[4] = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[5] = (ImDrawIdx)(idx2 + 0); // Left tri
                    _IdxWritePtr += 6;
                }
                else
                {
                    // Add indexes for four triangles
                    _IdxWritePtr[0] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[1] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[2] = (ImDrawIdx)(idx1 + 2); // Right tri 1
                    _IdxWritePtr[3] = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[4] = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[5] = (ImDrawIdx)(idx2 + 0); // Right tri 2
                    _IdxWritePtr[6] = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[7] = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[8] = (ImDrawIdx)(idx1 + 0); // Left tri 1
                    _IdxWritePtr[9] = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[10] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[11] = (ImDrawIdx)(idx2 + 1); // Left tri 2
                    _IdxWritePtr += 12;
                }

                idx1 = idx2;
            }

            // Add vertexes for each point on the line
            if (use_texture)
            {
                // If we're using textures we only need to emit the left/right edge vertices
                ImVec4 tex_uvs = _Data->TexUvLines[integer_thickness];
                /*if (fractional_thickness != 0.0f) // Currently always zero when use_texture==false!
                {
                    const ImVec4 tex_uvs_1 = _Data->TexUvLines[integer_thickness + 1];
                    tex_uvs.x = tex_uvs.x + (tex_uvs_1.x - tex_uvs.x) * fractional_thickness; // inlined ImLerp()
                    tex_uvs.y = tex_uvs.y + (tex_uvs_1.y - tex_uvs.y) * fractional_thickness;
                    tex_uvs.z = tex_uvs.z + (tex_uvs_1.z - tex_uvs.z) * fractional_thickness;
                    tex_uvs.w = tex_uvs.w + (tex_uvs_1.w - tex_uvs.w) * fractional_thickness;
                }*/
                ImVec2 tex_uv0(tex_uvs.x, tex_uvs.y);
                ImVec2 tex_uv1(tex_uvs.z, tex_uvs.w);
                for (int i = 0; i < points_count; i++)
                {
                    _VtxWritePtr[0].pos = temp_points[i * 2 + 0]; _VtxWritePtr[0].uv = tex_uv0; _VtxWritePtr[0].col = col; // Left-side outer edge
                    _VtxWritePtr[1].pos = temp_points[i * 2 + 1]; _VtxWritePtr[1].uv = tex_uv1; _VtxWritePtr[1].col = col; // Right-side outer edge
                    _VtxWritePtr += 2;
                }
            }
            else
            {
                // If we're not using a texture, we need the center vertex as well
                for (int i = 0; i < points_count; i++)
                {
                    _VtxWritePtr[0].pos = points[i];              _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col;       // Center of line
                    _VtxWritePtr[1].pos = temp_points[i * 2 + 0]; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col_trans; // Left-side outer edge
                    _VtxWritePtr[2].pos = temp_points[i * 2 + 1]; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col_trans; // Right-side outer edge
                    _VtxWritePtr += 3;
                }
            }
        }
        else
        {
            // [PATH 2] Non texture-based lines (thick): we need to draw the solid line core and thus require four vertices per point
            const float half_inner_thickness = (thickness - AA_SIZE) * 0.5f;

            // If line is not closed, the first and last points need to be generated differently as there are no normals to blend
            if (!closed)
            {
                const int points_last = points_count - 1;
                temp_points[0] = points[0] + temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[1] = points[0] + temp_normals[0] * (half_inner_thickness);
                temp_points[2] = points[0] - temp_normals[0] * (half_inner_thickness);
                temp_points[3] = points[0] - temp_normals[0] * (half_inner_thickness + AA_SIZE);
                temp_points[points_last * 4 + 0] = points[points_last] + temp_normals[points_last] * (half_inner_thickness + AA_SIZE);
                temp_points[points_last * 4 + 1] = points[points_last] + temp_normals[points_last] * (half_inner_thickness);
                temp_points[points_last * 4 + 2] = points[points_last] - temp_normals[points_last] * (half_inner_thickness);
                temp_points[points_last * 4 + 3] = points[points_last] - temp_normals[points_last] * (half_inner_thickness + AA_SIZE);
            }

            // Generate the indices to form a number of triangles for each line segment, and the vertices for the line edges
            // This takes points n and n+1 and writes into n+1, with the first point in a closed line being generated from the final one (as n+1 wraps)
            // FIXME-OPT: Merge the different loops, possibly remove the temporary buffer.
            unsigned int idx1 = _VtxCurrentIdx; // Vertex index for start of line segment
            for (int i1 = 0; i1 < count; i1++) // i1 is the first point of the line segment
            {
                const int i2 = (i1 + 1) == points_count ? 0 : (i1 + 1); // i2 is the second point of the line segment
                const unsigned int idx2 = (i1 + 1) == points_count ? _VtxCurrentIdx : (idx1 + 4); // Vertex index for end of segment

                // Average normals
                float dm_x = (temp_normals[i1].x + temp_normals[i2].x) * 0.5f;
                float dm_y = (temp_normals[i1].y + temp_normals[i2].y) * 0.5f;
                IM_FIXNORMAL2F(dm_x, dm_y);
                float dm_out_x = dm_x * (half_inner_thickness + AA_SIZE);
                float dm_out_y = dm_y * (half_inner_thickness + AA_SIZE);
                float dm_in_x = dm_x * half_inner_thickness;
                float dm_in_y = dm_y * half_inner_thickness;

                // Add temporary vertices
                ImVec2* out_vtx = &temp_points[i2 * 4];
                out_vtx[0].x = points[i2].x + dm_out_x;
                out_vtx[0].y = points[i2].y + dm_out_y;
                out_vtx[1].x = points[i2].x + dm_in_x;
                out_vtx[1].y = points[i2].y + dm_in_y;
                out_vtx[2].x = points[i2].x - dm_in_x;
                out_vtx[2].y = points[i2].y - dm_in_y;
                out_vtx[3].x = points[i2].x - dm_out_x;
                out_vtx[3].y = points[i2].y - dm_out_y;

                // Add indexes
                _IdxWritePtr[0]  = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[1]  = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[2]  = (ImDrawIdx)(idx1 + 2);
                _IdxWritePtr[3]  = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[4]  = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[5]  = (ImDrawIdx)(idx2 + 1);
                _IdxWritePtr[6]  = (ImDrawIdx)(idx2 + 1); _IdxWritePtr[7]  = (ImDrawIdx)(idx1 + 1); _IdxWritePtr[8]  = (ImDrawIdx)(idx1 + 0);
                _IdxWritePtr[9]  = (ImDrawIdx)(idx1 + 0); _IdxWritePtr[10] = (ImDrawIdx)(idx2 + 0); _IdxWritePtr[11] = (ImDrawIdx)(idx2 + 1);
                _IdxWritePtr[12] = (ImDrawIdx)(idx2 + 2); _IdxWritePtr[13] = (ImDrawIdx)(idx1 + 2); _IdxWritePtr[14] = (ImDrawIdx)(idx1 + 3);
                _IdxWritePtr[15] = (ImDrawIdx)(idx1 + 3); _IdxWritePtr[16] = (ImDrawIdx)(idx2 + 3); _IdxWritePtr[17] = (ImDrawIdx)(idx2 + 2);
                _IdxWritePtr += 18;

                idx1 = idx2;
            }

            // Add vertices
            for (int i = 0; i < points_count; i++)
            {
                _VtxWritePtr[0].pos = temp_points[i * 4 + 0]; _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col_trans;
                _VtxWritePtr[1].pos = temp_points[i * 4 + 1]; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col;
                _VtxWritePtr[2].pos = temp_points[i * 4 + 2]; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col;
                _VtxWritePtr[3].pos = temp_points[i * 4 + 3]; _VtxWritePtr[3].uv = opaque_uv; _VtxWritePtr[3].col = col_trans;
                _VtxWritePtr += 4;
            }
        }
        _VtxCurrentIdx += (ImDrawIdx)vtx_count;
    }
    else
    {
        // [PATH 4] Non texture-based, Non anti-aliased lines
        const int idx_count = count * 6;
        const int vtx_count = count * 4;    // FIXME-OPT: Not sharing edges
        PrimReserve(idx_count, vtx_count);

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1 + 1) == points_count ? 0 : i1 + 1;
            const ImVec2& p1 = points[i1];
            const ImVec2& p2 = points[i2];

            float dx = p2.x - p1.x;
            float dy = p2.y - p1.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            dx *= (thickness * 0.5f);
            dy *= (thickness * 0.5f);

            _VtxWritePtr[0].pos.x = p1.x + dy; _VtxWritePtr[0].pos.y = p1.y - dx; _VtxWritePtr[0].uv = opaque_uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr[1].pos.x = p2.x + dy; _VtxWritePtr[1].pos.y = p2.y - dx; _VtxWritePtr[1].uv = opaque_uv; _VtxWritePtr[1].col = col;
            _VtxWritePtr[2].pos.x = p2.x - dy; _VtxWritePtr[2].pos.y = p2.y + dx; _VtxWritePtr[2].uv = opaque_uv; _VtxWritePtr[2].col = col;
            _VtxWritePtr[3].pos.x = p1.x - dy; _VtxWritePtr[3].pos.y = p1.y + dx; _VtxWritePtr[3].uv = opaque_uv; _VtxWritePtr[3].col = col;
            _VtxWritePtr += 4;

            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx + 1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx + 2);
            _IdxWritePtr[3] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[4] = (ImDrawIdx)(_VtxCurrentIdx + 2); _IdxWritePtr[5] = (ImDrawIdx)(_VtxCurrentIdx + 3);
            _IdxWritePtr += 6;
            _VtxCurrentIdx += 4;
        }
    }
}